

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_ftruncate(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long *plVar1;
  undefined8 *puVar2;
  code *pcVar3;
  long lVar4;
  int iVar5;
  jx9_value *pjVar6;
  char *pcVar7;
  anon_union_8_3_18420de5_for_x aVar8;
  
  if ((((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (plVar1 = (long *)((*apArg)->x).pOther, plVar1 == (long *)0x0)) ||
     (*(int *)((long)plVar1 + 0x34) != 0xfeac14)) {
    jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,2,"Expecting an IO handle");
  }
  else {
    puVar2 = (undefined8 *)*plVar1;
    if ((puVar2 != (undefined8 *)0x0) && (pcVar3 = (code *)puVar2[0xd], pcVar3 != (code *)0x0)) {
      lVar4 = plVar1[1];
      pjVar6 = apArg[1];
      jx9MemObjToInteger(pjVar6);
      iVar5 = (*pcVar3)(lVar4,(pjVar6->x).rVal);
      if (iVar5 == 0) {
        *(undefined4 *)(plVar1 + 4) = 0;
        if ((*(uint *)(plVar1 + 5) & 4) != 0) {
          plVar1[3] = 0;
          *(undefined4 *)((long)plVar1 + 0x24) = 0;
          *(uint *)(plVar1 + 5) = *(uint *)(plVar1 + 5) & 0xfffffffb;
        }
        *(undefined4 *)(plVar1 + 6) = 0;
      }
      aVar8.iVal._1_7_ = 0;
      aVar8.iVal._0_1_ = iVar5 == 0;
      pjVar6 = pCtx->pRet;
      jx9MemObjRelease(pjVar6);
      pjVar6->x = aVar8;
      goto LAB_0013d356;
    }
    if (puVar2 == (undefined8 *)0x0) {
      pcVar7 = "null_stream";
    }
    else {
      pcVar7 = (char *)*puVar2;
    }
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,pcVar7);
  }
  pjVar6 = pCtx->pRet;
  jx9MemObjRelease(pjVar6);
  (pjVar6->x).rVal = 0.0;
LAB_0013d356:
  pjVar6->iFlags = pjVar6->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_ftruncate(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	int rc;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xTrunc == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	rc = pStream->xTrunc(pDev->pHandle, jx9_value_to_int64(apArg[1]));
	if( rc == JX9_OK ){
		/* Discard buffered data */
		ResetIOPrivate(pDev);
	}
	/* IO result */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;	
}